

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hypatia.h
# Opt level: O1

void quaternion_get_euler_anglesf3(quaternion *self,double *ax,double *ay,double *az)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  
  dVar5 = (self->field_0).q[3];
  dVar1 = (self->field_0).q[0];
  dVar2 = (self->field_0).q[1];
  dVar3 = (self->field_0).q[2];
  dVar4 = atan2(dVar2 * dVar3 + dVar5 * dVar1,0.5 - (dVar1 * dVar1 + dVar2 * dVar2));
  *ax = dVar4;
  dVar4 = asin((dVar1 * dVar3 - dVar2 * dVar5) * -2.0);
  *ay = dVar4;
  dVar5 = atan2(dVar1 * dVar2 + dVar5 * dVar3,0.5 - (dVar3 * dVar3 + dVar2 * dVar2));
  *az = dVar5;
  return;
}

Assistant:

HYPAPI void quaternion_get_euler_anglesf3(const struct quaternion *self, HYP_FLOAT *ax, HYP_FLOAT *ay, HYP_FLOAT *az)
{
	HYP_FLOAT qx, qy, qz, qw;

	qw = self->w;
	qx = self->x;
	qy = self->y;
	qz = self->z;

	*ax = HYP_ATAN2(qy * qz + qw * qx, 0.5f - ((qx * qx) + (qy * qy)));
	*ay = HYP_ASIN(-2.0f * ((qx * qz) - (qw * qy)));
	*az = HYP_ATAN2(((qx * qy) + (qw * qz)), 0.5f - ((qy * qy) + (qz * qz)));
}